

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  cmCTestUpdateHandler *this_00;
  cmCTestConfigureHandler *pcVar4;
  cmCTestBuildHandler *pcVar5;
  cmCTestTestHandler *pcVar6;
  cmCTestCoverageHandler *pcVar7;
  cmCTestMemCheckHandler *pcVar8;
  ulong uVar9;
  cmCTestSubmitHandler *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  bool local_6f5;
  bool local_6f4;
  bool local_6f3;
  bool local_6f2;
  bool local_6f1;
  bool local_6d2;
  string local_6c8 [32];
  undefined1 local_6a8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_530 [32];
  undefined1 local_510 [8];
  ostringstream cmCTestLog_msg_1;
  string local_398;
  undefined1 local_378 [8];
  string lastTestLog;
  ostringstream local_338 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string fullname;
  char *file;
  unsigned_long kk;
  Directory local_168;
  Directory d;
  string notes_dir;
  duration<long,_std::ratio<60L,_1L>_> local_138;
  duration<double,_std::ratio<1L,_1L>_> local_130;
  int local_124;
  duration<long,_std::ratio<60L,_1L>_> local_120;
  duration<double,_std::ratio<1L,_1L>_> local_118;
  int local_10c;
  duration<long,_std::ratio<60L,_1L>_> local_108;
  duration<double,_std::ratio<1L,_1L>_> local_100;
  int local_f4;
  duration<long,_std::ratio<60L,_1L>_> local_f0;
  duration<double,_std::ratio<1L,_1L>_> local_e8;
  int local_dc;
  duration<long,_std::ratio<60L,_1L>_> local_d8;
  duration<double,_std::ratio<1L,_1L>_> local_d0;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  cmCTestUpdateHandler *local_48;
  cmCTestUpdateHandler *uphandler;
  duration<long,_std::ratio<60L,_1L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  uint local_28;
  int local_24;
  Part p;
  int update_count;
  bool notest;
  cmCTest *pcStack_18;
  int res;
  cmCTest *this_local;
  
  update_count = 0;
  local_24 = 0;
  local_28 = 0;
  p._3_1_ = 1;
  pcStack_18 = this;
  while (p._3_1_ != PartStart >> 0x18 && local_28 != 0xc) {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + local_28);
    local_28 = local_28 + 1;
    p._3_1_ = (bVar1 ^ 0xff) & 1;
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 1);
  local_6d2 = false;
  if (bVar1) {
    local_30.__r = (rep_conflict)GetRemainingTimeAllowed(this);
    uphandler._4_4_ = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_38,(int *)((long)&uphandler + 4));
    local_6d2 = std::chrono::operator>(&local_30,&local_38);
  }
  if (local_6d2 != false) {
    this_00 = GetUpdateHandler(this);
    local_48 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"SourceDirectory",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"SourceDirectory",&local_c1);
    GetCTestConfiguration(&local_a0,this,&local_c0);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption
              (&this_00->super_cmCTestGenericHandler,&local_68,pcVar12);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    local_24 = (*(local_48->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
    if (local_24 < 0) {
      update_count = update_count | 1;
    }
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar3->TestModel == 2) && (local_24 == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 2);
    local_6f1 = false;
    if (bVar1) {
      local_d0.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_dc = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_d8,&local_dc);
      local_6f1 = std::chrono::operator>(&local_d0,&local_d8);
    }
    if (local_6f1 != false) {
      pcVar4 = GetConfigureHandler(this);
      iVar2 = (*(pcVar4->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 2;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 3);
    local_6f2 = false;
    if (bVar1) {
      local_e8.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_f4 = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_f0,&local_f4);
      local_6f2 = std::chrono::operator>(&local_e8,&local_f0);
    }
    if (local_6f2 != false) {
      UpdateCTestConfiguration(this);
      pcVar5 = GetBuildHandler(this);
      iVar2 = (*(pcVar5->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 4;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 4);
    if ((bVar1) || (local_6f3 = false, (p._3_1_ & 1) != PartStart >> 0x18)) {
      local_100.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_10c = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_108,&local_10c);
      local_6f3 = std::chrono::operator>(&local_100,&local_108);
    }
    if (local_6f3 != false) {
      UpdateCTestConfiguration(this);
      pcVar6 = GetTestHandler(this);
      iVar2 = (*(pcVar6->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 8;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 5);
    local_6f4 = false;
    if (bVar1) {
      local_118.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_124 = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_120,&local_124);
      local_6f4 = std::chrono::operator>(&local_118,&local_120);
    }
    if (local_6f4 != false) {
      UpdateCTestConfiguration(this);
      pcVar7 = GetCoverageHandler(this);
      iVar2 = (*(pcVar7->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x20;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 6);
    local_6f5 = false;
    if (bVar1) {
      local_130.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      notes_dir.field_2._12_4_ = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_138,
                 (int *)(notes_dir.field_2._M_local_buf + 0xc));
      local_6f5 = std::chrono::operator>(&local_130,&local_138);
    }
    if (local_6f5 != false) {
      UpdateCTestConfiguration(this);
      pcVar8 = GetMemCheckHandler(this);
      iVar2 = (*(pcVar8->super_cmCTestTestHandler).super_cmCTestGenericHandler.
                _vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x10;
      }
    }
    if ((p._3_1_ & 1) == PartStart >> 0x18) {
      pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                     &pPVar3->BinaryDir,"/Testing/Notes");
      bVar1 = cmsys::SystemTools::FileIsDirectory
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d);
      if (bVar1) {
        cmsys::Directory::Directory(&local_168);
        cmsys::Directory::Load(&local_168,(string *)&d,(string *)0x0);
        for (file = (char *)0x0; pcVar12 = (char *)cmsys::Directory::GetNumberOfFiles(&local_168),
            file < pcVar12; file = file + 1) {
          fullname.field_2._8_8_ = cmsys::Directory::GetFile(&local_168,(unsigned_long)file);
          std::operator+(&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,"/"
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,&local_1c0,(char *)fullname.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_1c0);
          bVar1 = cmsys::SystemTools::FileExists((string *)local_1a0);
          if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_1a0), !bVar1))
          {
            std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                      (&this->Impl);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              std::__cxx11::string::operator+=((string *)&pPVar3->NotesFiles,";");
            }
            pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            std::__cxx11::string::operator+=((string *)&pPVar3->NotesFiles,(string *)local_1a0);
            pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            Private::PartInfo::Enable(pPVar3->Parts + 8);
          }
          std::__cxx11::string::~string((string *)local_1a0);
        }
        cmsys::Directory::~Directory(&local_168);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 8);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                (&this->Impl);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        GenerateNotesFile(this,&pPVar3->NotesFiles);
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 7);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      pcVar10 = GetSubmitHandler(this);
      iVar2 = (*(pcVar10->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x40;
      }
    }
    if (update_count != 0) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      poVar11 = std::operator<<((ostream *)local_338,"Errors while running CTest");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar12 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x3ff,pcVar12,false);
      std::__cxx11::string::~string((string *)(lastTestLog.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_338);
      pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      if ((pPVar3->OutputTestOutputOnTestFailure & 1U) == 0) {
        GetBinaryDir_abi_cxx11_(&local_398,this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378,&local_398,"/Testing/Temporary/LastTest.log");
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_510);
        poVar11 = std::operator<<((ostream *)local_510,"Output from these tests are in: ");
        poVar11 = std::operator<<(poVar11,(string *)local_378);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar12 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x405,pcVar12,false);
        std::__cxx11::string::~string(local_530);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_510);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
        poVar11 = std::operator<<((ostream *)local_6a8,
                                  "Use \"--rerun-failed --output-on-failure\" to re-run the failed cases verbosely."
                                 );
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar12 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x409,pcVar12,false);
        std::__cxx11::string::~string(local_6c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
        std::__cxx11::string::~string((string *)local_378);
      }
    }
    this_local._4_4_ = update_count;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount;
       p = static_cast<Part>(p + 1)) {
    notest = !this->Impl->Parts[p];
  }
  if (this->Impl->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    cmCTestUpdateHandler* uphandler = this->GetUpdateHandler();
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->Impl->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Impl->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    if (this->GetConfigureHandler()->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetBuildHandler()->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Impl->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetTestHandler()->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Impl->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetCoverageHandler()->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetMemCheckHandler()->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->Impl->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->Impl->NotesFiles.empty()) {
            this->Impl->NotesFiles += ";";
          }
          this->Impl->NotesFiles += fullname;
          this->Impl->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Impl->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->Impl->NotesFiles.empty()) {
      this->GenerateNotesFile(this->Impl->NotesFiles);
    }
  }
  if (this->Impl->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetSubmitHandler()->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
    if (!this->Impl->OutputTestOutputOnTestFailure) {
      const std::string lastTestLog =
        this->GetBinaryDir() + "/Testing/Temporary/LastTest.log";
      cmCTestLog(this, ERROR_MESSAGE,
                 "Output from these tests are in: " << lastTestLog
                                                    << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Use \"--rerun-failed --output-on-failure\" to re-run the "
                 "failed cases verbosely."
                   << std::endl);
    }
  }
  return res;
}